

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCReg expr_toanyreg(FuncState *fs,ExpDesc *e)

{
  ExpDesc *e_local;
  FuncState *fs_local;
  
  expr_discharge(fs,e);
  if (e->k == VNONRELOC) {
    if (e->t == e->f) {
      return (e->u).s.info;
    }
    if (fs->nactvar <= (e->u).s.info) {
      expr_toreg(fs,e,(e->u).s.info);
      return (e->u).s.info;
    }
  }
  expr_tonextreg(fs,e);
  return (e->u).s.info;
}

Assistant:

static BCReg expr_toanyreg(FuncState *fs, ExpDesc *e)
{
  expr_discharge(fs, e);
  if (e->k == VNONRELOC) {
    if (!expr_hasjump(e)) return e->u.s.info;  /* Already in a register. */
    if (e->u.s.info >= fs->nactvar) {
      expr_toreg(fs, e, e->u.s.info);  /* Discharge to temp. register. */
      return e->u.s.info;
    }
  }
  expr_tonextreg(fs, e);  /* Discharge to next register. */
  return e->u.s.info;
}